

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_aes_encrypt.c
# Opt level: O0

int tc_aes128_set_encrypt_key(TCAesKeySched_t s,uint8_t *k)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint local_60;
  uint local_5c;
  uint t;
  uint i;
  uint rconst [11];
  uint8_t *k_local;
  TCAesKeySched_t s_local;
  
  memcpy(&t,&DAT_0012ea20,0x2c);
  if (s == (TCAesKeySched_t)0x0) {
    s_local._4_4_ = 0;
  }
  else if (k == (uint8_t *)0x0) {
    s_local._4_4_ = 0;
  }
  else {
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      s->words[local_5c] =
           (uint)k[local_5c << 2] << 0x18 | (uint)k[local_5c * 4 + 1] << 0x10 |
           (uint)k[local_5c * 4 + 2] << 8 | (uint)k[local_5c * 4 + 3];
    }
    for (; local_5c < 0x2c; local_5c = local_5c + 1) {
      local_60 = s->words[local_5c - 1];
      if ((local_5c & 3) == 0) {
        uVar4 = rotword(local_60);
        bVar1 = sbox[uVar4 >> 0x18];
        uVar4 = rotword(local_60);
        bVar2 = sbox[uVar4 >> 0x10 & 0xff];
        uVar4 = rotword(local_60);
        bVar3 = sbox[uVar4 >> 8 & 0xff];
        uVar4 = rotword(local_60);
        local_60 = ((uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 |
                   (uint)sbox[uVar4 & 0xff]) ^ (&t)[local_5c >> 2];
      }
      s->words[local_5c] = s->words[local_5c - 4] ^ local_60;
    }
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

int tc_aes128_set_encrypt_key(TCAesKeySched_t s, const uint8_t *k)
{
	const unsigned int rconst[11] = {
		0x00000000, 0x01000000, 0x02000000, 0x04000000, 0x08000000, 0x10000000,
		0x20000000, 0x40000000, 0x80000000, 0x1b000000, 0x36000000
	};
	unsigned int i;
	unsigned int t;

	if (s == (TCAesKeySched_t) 0) {
		return TC_CRYPTO_FAIL;
	} else if (k == (const uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	}

	for (i = 0; i < Nk; ++i) {
		s->words[i] = (k[Nb*i]<<24) | (k[Nb*i+1]<<16) |
			      (k[Nb*i+2]<<8) | (k[Nb*i+3]);
	}

	for (; i < (Nb * (Nr + 1)); ++i) {
		t = s->words[i-1];
		if ((i % Nk) == 0) {
			t = subword(rotword(t)) ^ rconst[i/Nk];
		}
		s->words[i] = s->words[i-Nk] ^ t;
	}

	return TC_CRYPTO_SUCCESS;
}